

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unicode_filenames.cc
# Opt level: O3

int main(int argc,char **argv)

{
  copy((EVP_PKEY_CTX *)anon_var_dwarf_8fd,(EVP_PKEY_CTX *)argv);
  copy((EVP_PKEY_CTX *)anon_var_dwarf_907,(EVP_PKEY_CTX *)argv);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"created Unicode filenames",0x19);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  return 0;
}

Assistant:

int
main(int argc, char* argv[])
{
    // Explicit UTF-8 encoding
    char const* f1 = "auto-\xc3\xbc.pdf";
    char const* f2 = "auto-\xc3\xb6\xcf\x80.pdf";
    copy(f1);
    copy(f2);
    std::cout << "created Unicode filenames" << std::endl;
    return 0;
}